

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

boolean e_survives_at(entity *etmp,int x,int y)

{
  boolean bVar1;
  bool local_22;
  bool local_21;
  int y_local;
  int x_local;
  entity *etmp_local;
  
  if (etmp->edata->mlet == '6') {
    return '\x01';
  }
  bVar1 = is_pool(level,x,y);
  if (bVar1 == '\0') {
    bVar1 = is_lava(level,x,y);
    if (bVar1 != '\0') {
      if (((etmp->emon != &youmonst) ||
          (((((local_22 = true, u.uprops[0x12].intrinsic == 0 &&
              (local_22 = true, u.uprops[0x12].extrinsic == 0)) &&
             (local_22 = true, (youmonst.data)->mlet != '\x05')) &&
            ((local_22 = true, u.uprops[0x3c].extrinsic == 0 &&
             (local_22 = true, ((youmonst.data)->mflags1 & 1) == 0)))) &&
           ((u.usteed == (monst *)0x0 || (local_22 = true, ((u.usteed)->data->mflags1 & 1) == 0)))))
          ) && ((local_22 = true, etmp->edata != mons + 0xa0 &&
                (local_22 = true, etmp->edata != mons + 0x157)))) {
        local_22 = (etmp->edata->mflags1 & 1) != 0;
      }
      return local_22;
    }
    bVar1 = is_db_wall(x,y);
    if (bVar1 == '\0') {
      return '\x01';
    }
    if (etmp->emon != &youmonst) {
      return (etmp->edata->mflags1 & 8) != 0;
    }
    if (u.uprops[0x3e].intrinsic == 0) {
      if (u.uprops[0x3e].extrinsic == 0) {
        return ((youmonst.data)->mflags1 & 8) != 0;
      }
      return '\x01';
    }
    return '\x01';
  }
  if (etmp->emon == &youmonst) {
    if ((u.uprops[0x27].extrinsic != 0) &&
       (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) {
      return '\x01';
    }
    if (u.uprops[0x31].intrinsic != 0) {
      return '\x01';
    }
    if (u.uprops[0x31].extrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 0x600) != 0) {
      return '\x01';
    }
    if (u.uprops[0x39].intrinsic != 0) {
      return '\x01';
    }
    if (u.uprops[0x39].extrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 2) != 0) {
      return '\x01';
    }
    if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 2) != 0)) {
      return '\x01';
    }
    if (u.uprops[0x3c].extrinsic != 0) {
      return '\x01';
    }
    if (((youmonst.data)->mflags1 & 1) != 0) {
      return '\x01';
    }
    if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 1) != 0)) {
      return '\x01';
    }
    if (u.uprops[0x12].intrinsic != 0) {
      return '\x01';
    }
    if (u.uprops[0x12].extrinsic != 0) {
      return '\x01';
    }
    if ((youmonst.data)->mlet == '\x05') {
      return '\x01';
    }
  }
  local_21 = true;
  if (((etmp->edata->mflags1 & 2) == 0) && (local_21 = true, (etmp->edata->mflags1 & 1) == 0)) {
    local_21 = etmp->edata->mlet == '\x05';
  }
  return local_21;
}

Assistant:

static boolean e_survives_at(struct entity *etmp, int x, int y)
{
	if (noncorporeal(etmp->edata))
		return TRUE;
	if (is_pool(level, x, y))
		return (boolean)((is_u(etmp) &&
				(Wwalking || Amphibious || Swimming ||
				Flying || Levitation)) ||
			is_swimmer(etmp->edata) || is_flyer(etmp->edata) ||
			is_floater(etmp->edata));
	/* must force call to lava_effects in e_died if is_u */
	if (is_lava(level, x, y))
		return (boolean)((is_u(etmp) && (Levitation || Flying)) ||
			    likes_lava(etmp->edata) || is_flyer(etmp->edata));
	if (is_db_wall(x, y))
		return((boolean)(is_u(etmp) ? Passes_walls :
			passes_walls(etmp->edata)));
	return TRUE;
}